

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quaternion.c
# Opt level: O0

char * test_vector3_rotate_by_quaternion_xy_half_turn(void)

{
  int iVar1;
  vector3 *pvVar2;
  undefined1 local_48 [8];
  vector3 r;
  quaternion q;
  
  pvVar2 = vector3_get_reference_vector3(2);
  quaternion_set_from_axis_anglev3
            ((quaternion *)((long)&r.field_0 + 0x10),pvVar2,3.1415927410125732);
  pvVar2 = vector3_get_reference_vector3(1);
  pvVar2 = vector3_set((vector3 *)local_48,pvVar2);
  vector3_rotate_by_quaternion(pvVar2,(quaternion *)((long)&r.field_0 + 0x10));
  pvVar2 = vector3_get_reference_vector3(4);
  iVar1 = vector3_equals((vector3 *)local_48,pvVar2);
  if (iVar1 == 0) {
    q.field_0.q[3] = (double)anon_var_dwarf_22f;
  }
  else {
    q.field_0.q[3] = 0.0;
  }
  return (char *)q.field_0.q[3];
}

Assistant:

static char *test_vector3_rotate_by_quaternion_xy_half_turn(void)
{
	struct quaternion q;
	struct vector3 r;

	quaternion_set_from_axis_anglev3(&q, HYP_VECTOR3_UNIT_Y, HYP_TAU / 2.0f);
	vector3_rotate_by_quaternion(vector3_set(&r, HYP_VECTOR3_UNIT_X), &q);
	test_assert(vector3_equals(&r, HYP_VECTOR3_UNIT_X_NEGATIVE));

	return NULL;
}